

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall Clasp::Solver::force(Solver *this,ImpliedLiteral *p)

{
  uint uVar1;
  uint uVar2;
  Literal p_00;
  pointer pIVar3;
  bool bVar4;
  uint32 uVar5;
  ulong uVar6;
  uint level;
  long lVar7;
  
  uVar1 = (p->lit).rep_;
  uVar2 = *(uint *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc));
  if ((byte)((byte)uVar2 & 3) == (byte)(2U - ((uVar1 & 2) == 0))) {
    level = p->level;
    if (uVar2 >> 4 <= level) {
      return true;
    }
    uVar6 = (ulong)(this->impliedLits_).lits.ebo_.size;
    if (uVar6 != 0) {
      pIVar3 = (this->impliedLits_).lits.ebo_.buf;
      lVar7 = 0;
      do {
        if ((*(uint *)((long)&(pIVar3->lit).rep_ + lVar7) ^ uVar1) < 2) {
          if (*(uint *)((long)&pIVar3->level + lVar7) <= level) {
            return true;
          }
          *(undefined8 *)((long)&(pIVar3->lit).rep_ + lVar7) = *(undefined8 *)p;
          *(uint64 *)
           ((long)&(pIVar3->ante).super_pair<Clasp::Antecedent,_unsigned_int>.first.data_ + lVar7) =
               (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.first.data_;
          uVar5 = (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second;
          *(uint32 *)
           ((long)&(pIVar3->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second + lVar7) =
               uVar5;
          setReason(this,(Literal)(p->lit).rep_,(Antecedent *)&p->ante,uVar5);
          return true;
        }
        lVar7 = lVar7 + 0x18;
      } while (uVar6 * 0x18 != lVar7);
    }
  }
  else {
    level = p->level;
  }
  uVar5 = undoUntilImpl(this,level,false);
  if (uVar5 != p->level) {
    uVar1 = (this->levels_).super_type.ebo_.size;
    if ((this->impliedLits_).level < uVar1) {
      (this->impliedLits_).level = uVar1;
    }
    bk_lib::pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>::push_back
              (&(this->impliedLits_).lits,p);
  }
  p_00.rep_ = (p->lit).rep_;
  if (((byte)(*(byte *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(p_00.rep_ & 0xfffffffc)) &
             3) == (byte)(2U - ((p_00.rep_ & 2) == 0))) &&
     (bVar4 = setReason(this,p_00,(Antecedent *)&p->ante,
                        (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second), bVar4)) {
    return true;
  }
  bVar4 = force(this,&p->lit,(Antecedent *)&p->ante,
                (p->ante).super_pair<Clasp::Antecedent,_unsigned_int>.second);
  return bVar4;
}

Assistant:

bool Solver::force(const ImpliedLiteral& p) {
	// Already implied?
	if (isTrue(p.lit)) {
		if (level(p.lit.var()) <= p.level) { return true; }
		if (ImpliedLiteral* x = impliedLits_.find(p.lit)) {
			if (x->level > p.level) {
				*x = p;
				setReason(p.lit, p.ante.ante(), p.ante.data());
			}
			return true;
		}
	}
	if (undoUntil(p.level) != p.level) {
		// Logically the implication is on level p.level.
		// Store enough information so that p can be re-assigned once we backtrack.
		impliedLits_.add(decisionLevel(), p);
	}
	return (isTrue(p.lit) && setReason(p.lit, p.ante.ante(), p.ante.data())) || force(p.lit, p.ante.ante(), p.ante.data());
}